

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

tree * tree_reopen(tree *t,char *path,wchar_t restore_time)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t o_flag;
  wchar_t restore_time_local;
  char *path_local;
  tree *t_local;
  
  iVar1 = 0;
  if (restore_time != L'\0') {
    iVar1 = 0x80;
  }
  t->flags = iVar1;
  t->flags = t->flags | 0x100;
  t->visit_type = 0;
  t->tree_errno = 0;
  t->dirname_length = 0;
  t->depth = 0;
  t->descend = 0;
  t->current = (tree_entry *)0x0;
  t->d = (DIR *)0x0;
  t->symlink_mode = t->initial_symlink_mode;
  (t->path).length = 0;
  t->entry_fd = -1;
  t->entry_eof = 0;
  t->entry_remaining_bytes = 0;
  t->initial_filesystem_id = -1;
  tree_push(t,path,L'\0',0,0,(restore_time *)0x0);
  t->stack->flags = 4;
  t->openCount = 1;
  t->maxOpenCount = 1;
  iVar1 = open(".",0x80000);
  t->initial_dir_fd = iVar1;
  if (t->initial_dir_fd < 0) {
    iVar1 = open(".",0x280000);
    t->initial_dir_fd = iVar1;
  }
  __archive_ensure_cloexec_flag(t->initial_dir_fd);
  wVar2 = tree_dup(t->initial_dir_fd);
  t->working_dir_fd = wVar2;
  return t;
}

Assistant:

static struct tree *
tree_reopen(struct tree *t, const char *path, int restore_time)
{
#if defined(O_PATH)
	/* Linux */
	const int o_flag = O_PATH;
#elif defined(O_SEARCH)
	/* SunOS */
	const int o_flag = O_SEARCH;
#elif defined(__FreeBSD__) && defined(O_EXEC)
	/* FreeBSD */
	const int o_flag = O_EXEC;
#endif

	t->flags = (restore_time != 0)?needsRestoreTimes:0;
	t->flags |= onInitialDir;
	t->visit_type = 0;
	t->tree_errno = 0;
	t->dirname_length = 0;
	t->depth = 0;
	t->descend = 0;
	t->current = NULL;
	t->d = INVALID_DIR_HANDLE;
	t->symlink_mode = t->initial_symlink_mode;
	archive_string_empty(&t->path);
	t->entry_fd = -1;
	t->entry_eof = 0;
	t->entry_remaining_bytes = 0;
	t->initial_filesystem_id = -1;

	/* First item is set up a lot like a symlink traversal. */
	tree_push(t, path, 0, 0, 0, NULL);
	t->stack->flags = needsFirstVisit;
	t->maxOpenCount = t->openCount = 1;
	t->initial_dir_fd = open(".", O_RDONLY | O_CLOEXEC);
#if defined(O_PATH) || defined(O_SEARCH) || \
 (defined(__FreeBSD__) && defined(O_EXEC))
	/*
	 * Most likely reason to fail opening "." is that it's not readable,
	 * so try again for execute. The consequences of not opening this are
	 * unhelpful and unnecessary errors later.
	 */
	if (t->initial_dir_fd < 0)
		t->initial_dir_fd = open(".", o_flag | O_CLOEXEC);
#endif
	__archive_ensure_cloexec_flag(t->initial_dir_fd);
	t->working_dir_fd = tree_dup(t->initial_dir_fd);
	return (t);
}